

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

bool __thiscall ON_ClippingPlaneData::HasDefaultContent(ON_ClippingPlaneData *this)

{
  undefined1 uVar1;
  int iVar2;
  
  if ((this->m_depth == 0.0) && (!NAN(this->m_depth))) {
    iVar2 = ON_UuidList::Count(&this->m_object_id_list);
    uVar1 = 0;
    if ((iVar2 < 1) && ((this->m_layer_list).m_count < 1)) {
      uVar1 = this->m_is_exclusion_list;
    }
    return (bool)uVar1;
  }
  return false;
}

Assistant:

bool ON_ClippingPlaneData::HasDefaultContent() const
{
  if (m_depth != 0.0)
    return false;
  
  if (m_object_id_list.Count()>0)
    return false;

  if (m_layer_list.Count() > 0)
    return false;
  
  if (!m_is_exclusion_list)
    return false;

  return true;
}